

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueConvert(defV *val,DataType newType)

{
  vector<double,_std::allocator<double>_> *val_00;
  NamedPoint *__rhs;
  int in_EDX;
  uint uVar1;
  char *in_RSI;
  NamedPoint *in_RDI;
  defV *unaff_retaddr;
  NamedPoint point;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  vector<double,_std::allocator<double>_> vec;
  string value_3;
  Time value_2;
  int64_t value_1;
  double value;
  size_t index;
  NamedPoint *in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff30;
  complex<double> local_90;
  double *in_stack_ffffffffffffff88;
  defV *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffffc8;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (uint)in_RSI;
  val_00 = (vector<double,_std::allocator<double>_> *)
           std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)in_RDI,in_RSI,in_EDX);
  __rhs = (NamedPoint *)(ulong)uVar1;
  switch(__rhs) {
  case (NamedPoint *)0x0:
  case (NamedPoint *)0x9:
  default:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x2) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa8);
      valueExtract(unaff_retaddr,&in_RDI->name);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff30,&__rhs->name);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff10);
    }
    break;
  case (NamedPoint *)0x1:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x0) {
      valueExtract<double>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff30,(double *)__rhs);
    }
    break;
  case (NamedPoint *)0x2:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x1) {
      valueExtract<long>(in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff30,(long *)__rhs);
    }
    break;
  case (NamedPoint *)0x3:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x3) {
      std::complex<double>::complex(&local_90,0.0,0.0);
      valueExtract((defV *)in_stack_ffffffffffffffc0,(complex<double> *)in_stack_ffffffffffffffb8);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff30,(complex<double> *)__rhs);
    }
    break;
  case (NamedPoint *)0x4:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x4) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x2b726d);
      valueExtract((defV *)CONCAT44(uVar1,in_stack_fffffffffffffff0),val_00);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff30,(vector<double,_std::allocator<double>_> *)__rhs);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
    }
    break;
  case (NamedPoint *)0x5:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x5) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x2b732d);
      valueExtract((defV *)in_stack_ffffffffffffffd0.internalTimeCode,in_stack_ffffffffffffffc8);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff30,
                  (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)__rhs);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_ffffffffffffff20);
    }
    break;
  case (NamedPoint *)0x6:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x6) {
      NamedPoint::NamedPoint(in_stack_ffffffffffffff10);
      valueExtract(unaff_retaddr,in_RDI);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff30,__rhs);
      NamedPoint::~NamedPoint((NamedPoint *)0x2b73cc);
    }
    break;
  case (NamedPoint *)0x8:
    if (val_00 != (vector<double,_std::allocator<double>_> *)0x1) {
      memset(&stack0xffffffffffffffd0,0,8);
      valueExtract((defV *)in_stack_ffffffffffffffd0.internalTimeCode,
                   (Time *)in_stack_ffffffffffffffc8);
      TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffd0);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff30,(long *)__rhs);
    }
    break;
  case (NamedPoint *)0x1e:
  }
  return;
}

Assistant:

void valueConvert(defV& val, DataType newType)
{
    auto index = val.index();
    switch (newType) {
        case DataType::HELICS_DOUBLE: {
            if (index == double_loc) {
                return;
            }
            double value{0};
            valueExtract(val, value);
            val = value;
            break;
        }
        case DataType::HELICS_INT: {
            if (index == int_loc) {
                return;
            }
            int64_t value{0};
            valueExtract(val, value);
            val = value;
            break;
        }
        case DataType::HELICS_TIME: {
            if (index == int_loc) {
                return;
            }
            Time value{timeZero};
            valueExtract(val, value);
            val = value.getBaseTimeCode();
            break;
        }
        case DataType::HELICS_JSON:
            break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            if (index == string_loc) {
                return;
            }
            std::string value;
            valueExtract(val, value);
            val = std::move(value);
            break;
        }
        case DataType::HELICS_VECTOR: {
            if (index == vector_loc) {
                return;
            }
            std::vector<double> vec;
            valueExtract(val, vec);
            val = std::move(vec);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            if (index == complex_loc) {
                return;
            }
            std::complex<double> cval;
            valueExtract(val, cval);
            val = cval;
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            if (index == complex_vector_loc) {
                return;
            }
            std::vector<std::complex<double>> cvec;
            valueExtract(val, cvec);
            val = std::move(cvec);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            if (index == named_point_loc) {
                return;
            }
            NamedPoint point;
            valueExtract(val, point);
            val = std::move(point);
            break;
        }
    }
}